

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O3

StringPiece re2::EngineName(Engine e)

{
  size_t sVar1;
  char *__s;
  StringPiece SVar2;
  LogMessage LStack_198;
  
  if ((int)e < 0) {
    LogMessage::LogMessage
              (&LStack_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_198.str_,"Check failed: (e) >= (0)",0x18);
LAB_0011cfad:
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_198);
  }
  else if (kEnginePCRE < e) {
    LogMessage::LogMessage
              (&LStack_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_198.str_,
               "Check failed: (e) < ((int)(sizeof(engine_names)/sizeof((engine_names)[0])))",0x4b);
    goto LAB_0011cfad;
  }
  __s = *(char **)(engine_names + (ulong)e * 8);
  if (__s == (char *)0x0) {
    LogMessage::LogMessage
              (&LStack_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_198.str_,"Check failed: engine_names[e] != NULL",0x25);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_198);
    __s = *(char **)(engine_names + (ulong)e * 8);
    if (__s == (char *)0x0) {
      __s = (char *)0x0;
      sVar1 = 0;
      goto LAB_0011d013;
    }
  }
  sVar1 = strlen(__s);
LAB_0011d013:
  SVar2._8_8_ = sVar1;
  SVar2.ptr_ = __s;
  return SVar2;
}

Assistant:

static StringPiece EngineName(Engine e) {
  CHECK_GE(e, 0);
  CHECK_LT(e, arraysize(engine_names));
  CHECK(engine_names[e] != NULL);
  return engine_names[e];
}